

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab1.cpp
# Opt level: O3

int main(void)

{
  std::ostream::operator<<((ostream *)&std::cout,5);
  std::ostream::_M_insert<double>(5.0);
  return 0;
}

Assistant:

int main() {
    int i;
    double d;
    i = 5;
    d = 5;
    std::cout << i << d;
    return 0;
}